

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O0

Hop_Obj_t * Hop_And(Hop_Man_t *p,Hop_Obj_t *p0,Hop_Obj_t *p1)

{
  Hop_Obj_t *pHVar1;
  Hop_Man_t *local_50;
  Hop_Man_t *local_48;
  Hop_Obj_t *pResult;
  Hop_Obj_t *pGhost;
  Hop_Obj_t *p1_local;
  Hop_Obj_t *p0_local;
  Hop_Man_t *p_local;
  
  p_local = (Hop_Man_t *)p0;
  if (p0 != p1) {
    pHVar1 = Hop_Not(p1);
    if (p0 == pHVar1) {
      p_local = (Hop_Man_t *)Hop_Not(p->pConst1);
    }
    else {
      pHVar1 = Hop_Regular(p0);
      if (pHVar1 == p->pConst1) {
        local_48 = (Hop_Man_t *)p1;
        if (p0 != p->pConst1) {
          local_48 = (Hop_Man_t *)Hop_Not(p->pConst1);
        }
        p_local = local_48;
      }
      else {
        pHVar1 = Hop_Regular(p1);
        if (pHVar1 == p->pConst1) {
          local_50 = (Hop_Man_t *)p0;
          if (p1 != p->pConst1) {
            local_50 = (Hop_Man_t *)Hop_Not(p->pConst1);
          }
          p_local = local_50;
        }
        else {
          pHVar1 = Hop_ObjCreateGhost(p,p0,p1,AIG_AND);
          p_local = (Hop_Man_t *)Hop_TableLookup(p,pHVar1);
          if (p_local == (Hop_Man_t *)0x0) {
            p_local = (Hop_Man_t *)Hop_ObjCreate(p,pHVar1);
          }
        }
      }
    }
  }
  return (Hop_Obj_t *)p_local;
}

Assistant:

Hop_Obj_t * Hop_And( Hop_Man_t * p, Hop_Obj_t * p0, Hop_Obj_t * p1 )
{
    Hop_Obj_t * pGhost, * pResult;
//    Hop_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Hop_Not(p1) )
        return Hop_Not(p->pConst1);
    if ( Hop_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Hop_Not(p->pConst1);
    if ( Hop_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Hop_Not(p->pConst1);
    // check if it can be an EXOR gate
//    if ( Hop_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
//        return Hop_Exor( p, pFan0, pFan1 );
    // check the table
    pGhost = Hop_ObjCreateGhost( p, p0, p1, AIG_AND );
    if ( (pResult = Hop_TableLookup( p, pGhost )) )
        return pResult;
    return Hop_ObjCreate( p, pGhost );
}